

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::FileGenerator::ShouldIncludeDependency
          (FileGenerator *this,FileDescriptor *descriptor,bool immutable_api)

{
  bool bVar1;
  undefined7 in_register_00000011;
  string_view filename;
  
  filename._M_str._1_7_ = in_register_00000011;
  filename._M_str._0_1_ = immutable_api;
  if ((this->options_).strip_nonfunctional_codegen == true) {
    filename._M_len = (size_t)(descriptor->name_->_M_dataplus)._M_p;
    bVar1 = IsKnownFeatureProto((compiler *)descriptor->name_->_M_string_length,filename);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileGenerator::ShouldIncludeDependency(const FileDescriptor* descriptor,
                                            bool immutable_api) {
  // Skip feature imports, which are a visible (but non-functional) deviation
  // between editions and legacy syntax.
  if (options_.strip_nonfunctional_codegen &&
      IsKnownFeatureProto(descriptor->name())) {
    return false;
  }

  return true;
}